

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData *
cfd::core::CryptoUtil::EncryptAes256Cbc
          (ByteData *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *iv,string *data)

{
  ByteData byte_data;
  ByteData local_60;
  ByteData local_48;
  ByteData local_30;
  
  ByteData::ByteData(&local_30,(uint8_t *)(data->_M_dataplus)._M_p,(uint32_t)data->_M_string_length)
  ;
  ByteData::ByteData(&local_48,key);
  ByteData::ByteData(&local_60,iv);
  EncryptAes256Cbc(__return_storage_ptr__,&local_48,&local_60,&local_30);
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::EncryptAes256Cbc(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &iv,
    const std::string &data) {
  ByteData byte_data(
      reinterpret_cast<const uint8_t *>(data.data()),
      static_cast<uint32_t>(data.size()));
  return EncryptAes256Cbc(ByteData(key), ByteData(iv), byte_data);
}